

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCaseExpression::Deserialize(BoundCaseExpression *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  _Head_base<0UL,_duckdb::BoundCaseExpression_*,_false> this_00;
  pointer pBVar3;
  byte bVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  LogicalType return_type;
  _Tuple_impl<0UL,_duckdb::BoundCaseExpression_*,_std::default_delete<duckdb::BoundCaseExpression>_>
  local_98;
  LogicalType local_90;
  vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  optional_idx local_48;
  LogicalType local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_90,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00._M_head_impl = (BoundCaseExpression *)operator_new(0x78);
  LogicalType::LogicalType(&local_40,&local_90);
  BoundCaseExpression(this_00._M_head_impl,&local_40);
  local_98.super__Head_base<0UL,_duckdb::BoundCaseExpression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::BoundCaseExpression_*,_false>)
       (_Head_base<0UL,_duckdb::BoundCaseExpression_*,_false>)this_00._M_head_impl;
  LogicalType::~LogicalType(&local_40);
  pBVar3 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                         *)&local_98);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"case_checks");
  if ((char)uVar1 == '\0') {
    local_78.super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pBVar3->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_78.super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pBVar3->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_78.super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pBVar3->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (pBVar3->case_checks).
    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar3->case_checks).
    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar3->case_checks).
    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48.index = 0;
    ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::~vector
              (&local_78);
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::BoundCaseCheck,true>>((type *)&local_58,deserializer);
    local_78.super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pBVar3->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    (pBVar3->case_checks).
    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_48.index;
    local_78.super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pBVar3->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_78.super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pBVar3->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (pBVar3->case_checks).
    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._M_allocated_capacity;
    (pBVar3->case_checks).
    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
    super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48.index = 0;
    ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::~vector
              (&local_78);
  }
  ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::~vector
            ((vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_> *)&local_58);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pBVar3 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                         *)&local_98);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"else_expr");
  bVar4 = (byte)iVar2;
  if (bVar4 == 0) {
    _Var5._M_head_impl =
         (pBVar3->else_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar3->else_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var5._M_head_impl == (Expression *)0x0) {
      bVar4 = 0;
      goto LAB_005b6636;
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var6._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&local_78,deserializer);
      _Var6._M_head_impl =
           (Expression *)
           local_78.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var5._M_head_impl =
         (pBVar3->else_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar3->else_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var5._M_head_impl == (Expression *)0x0) {
      bVar4 = 1;
      goto LAB_005b6636;
    }
  }
  (*((_Var5._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_005b6636:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar4);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_98.super__Head_base<0UL,_duckdb::BoundCaseExpression_*,_false>._M_head_impl;
  LogicalType::~LogicalType(&local_90);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundCaseExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto result = duckdb::unique_ptr<BoundCaseExpression>(new BoundCaseExpression(std::move(return_type)));
	deserializer.ReadPropertyWithDefault<vector<BoundCaseCheck>>(201, "case_checks", result->case_checks);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(202, "else_expr", result->else_expr);
	return std::move(result);
}